

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::DecodeSortKeyList
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_t dVar2;
  Vector *result_00;
  idx_t iVar3;
  reference vector_data_00;
  idx_t size;
  long lVar4;
  
  dVar2 = decode_data->data[decode_data->position];
  decode_data->position = decode_data->position + 1;
  if (dVar2 == vector_data->null_byte) {
    FlatVector::VerifyFlatVector(result);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
    return;
  }
  lVar4 = 0;
  dVar2 = 0xff;
  if (vector_data->flip_bytes == false) {
    dVar2 = '\0';
  }
  pdVar1 = result->data;
  result_00 = ListVector::GetEntry(result);
  iVar3 = ListVector::GetListSize(result);
  size = iVar3;
  while (dVar2 != decode_data->data[decode_data->position]) {
    ListVector::Reserve(result,size + 1);
    vector_data_00 =
         vector<duckdb::DecodeSortKeyVectorData,_true>::get<true>(&vector_data->child_data,0);
    DecodeSortKeyRecursive(decode_data,vector_data_00,result_00,size);
    lVar4 = lVar4 + 1;
    size = size + 1;
  }
  decode_data->position = decode_data->position + 1;
  *(long *)(pdVar1 + result_idx * 0x10 + 8) = lVar4;
  *(idx_t *)(pdVar1 + result_idx * 0x10) = iVar3;
  ListVector::SetListSize(result,size);
  return;
}

Assistant:

void DecodeSortKeyList(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                       idx_t result_idx) {
	// check if the top-level is valid or not
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// entire list is NULL
		FlatVector::Validity(result).SetInvalid(result_idx);
		return;
	}
	// list is valid - decode child elements
	// we don't know how many there will be
	// decode child elements until we encounter the list delimiter
	auto list_delimiter = SortKeyVectorData::LIST_DELIMITER;
	if (vector_data.flip_bytes) {
		list_delimiter = ~list_delimiter;
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &child_vector = ListVector::GetEntry(result);
	// get the current list size
	auto start_list_size = ListVector::GetListSize(result);
	auto new_list_size = start_list_size;
	// loop until we find the list delimiter
	while (decode_data.data[decode_data.position] != list_delimiter) {
		// found a valid entry here - decode it
		// first reserve space for it
		new_list_size++;
		ListVector::Reserve(result, new_list_size);

		// now decode the entry
		DecodeSortKeyRecursive(decode_data, vector_data.child_data[0], child_vector, new_list_size - 1);
	}
	// skip the list delimiter
	decode_data.position++;
	// set the list_entry_t information and update the list size
	list_data[result_idx].length = new_list_size - start_list_size;
	list_data[result_idx].offset = start_list_size;
	ListVector::SetListSize(result, new_list_size);
}